

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_state_auth_digest_resp_resp(connectdata *conn,int pop3code,pop3state instate)

{
  CURLcode CVar1;
  undefined4 in_register_00000014;
  
  if (pop3code == 0x2b) {
    CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"",CONCAT44(in_register_00000014,instate));
    if (CVar1 == CURLE_OK) {
      (conn->proto).ftpc.count2 = 0xc;
      CVar1 = CURLE_OK;
    }
  }
  else {
    Curl_failf(conn->data,"Authentication failed: %d",(ulong)(uint)pop3code);
    CVar1 = CURLE_LOGIN_DENIED;
  }
  return CVar1;
}

Assistant:

static CURLcode pop3_state_auth_digest_resp_resp(struct connectdata *conn,
                                                 int pop3code,
                                                 pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;

  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    failf(data, "Authentication failed: %d", pop3code);
    result = CURLE_LOGIN_DENIED;
  }
  else {
    /* Send an empty response */
    result = Curl_pp_sendf(&conn->proto.pop3c.pp, "");

    if(!result)
      state(conn, POP3_AUTH);
  }

  return result;
}